

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall trieste::logging::Log::start(Log *this,LogLevel level)

{
  size_t sVar1;
  long in_FS_OFFSET;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&this->strstream);
  if (level == String) {
    this->print = ActiveNoOutput;
    this->indent_chars = 0;
    return;
  }
  this->print = Active;
  sVar1 = *(size_t *)(in_FS_OFFSET + -0x70);
  this->indent_chars = sVar1;
  if (header_callback_abi_cxx11_.super__Function_base._M_manager != (_Manager_type)0x0) {
    this->indent_chars = sVar1 + 5;
    CLI::std::
    function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&header_callback_abi_cxx11_,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->strstream);
    return;
  }
  *(long *)((this->strstream).data +
           *(long *)(*(long *)((this->strstream).data + 0x10) + -0x18) + 0x20) = (long)(int)sVar1;
  std::operator<<((ostream *)((this->strstream).data + 0x10),"");
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void start(detail::LogLevel level)
    {
      strstream.init();
      if (level == detail::LogLevel::String)
      {
        print = Status::ActiveNoOutput;
        indent_chars = 0;
        return;
      }
      print = Status::Active;
      indent_chars = thread_local_indent();
      if (header_callback)
      {
        // Indent all lines after a header by 5 spaces.
        indent_chars = 5 + thread_local_indent();
        // Add the header.
        header_callback(strstream.get());
      }
      else
      {
        strstream.get() << std::setw(indent_chars) << "";
      }
    }